

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fgetc.c
# Opt level: O1

int fgetc(FILE *__stream)

{
  char *pcVar1;
  int iVar2;
  byte *pbVar3;
  uint uVar4;
  
  mtx_lock((mtx_t *)&__stream->_IO_save_base);
  iVar2 = _PDCLIB_prepread((_PDCLIB_file_t *)__stream);
  uVar4 = 0xffffffff;
  if (iVar2 != -1) {
    if ((__stream->_IO_read_base == __stream->_IO_write_base) &&
       (__stream->_IO_buf_base == (char *)0x0)) {
      iVar2 = _PDCLIB_fillbuffer((_PDCLIB_file_t *)__stream);
      if (iVar2 == -1) goto LAB_001011dc;
    }
    pcVar1 = __stream->_IO_buf_base;
    if (pcVar1 == (char *)0x0) {
      pcVar1 = __stream->_IO_read_base;
      __stream->_IO_read_base = pcVar1 + 1;
      pbVar3 = (byte *)(pcVar1 + (long)__stream->_IO_read_ptr);
    }
    else {
      __stream->_IO_buf_base = pcVar1 + -1;
      pbVar3 = (byte *)(pcVar1 + (long)__stream + 0x3f);
    }
    uVar4 = (uint)*pbVar3;
  }
LAB_001011dc:
  mtx_unlock((mtx_t *)&__stream->_IO_save_base);
  return uVar4;
}

Assistant:

int fgetc( struct _PDCLIB_file_t * stream )
{
    int rc = EOF;

    _PDCLIB_LOCK( stream->mtx );

    if ( _PDCLIB_prepread( stream ) != EOF )
    {
        if ( _PDCLIB_CHECKBUFFER( stream ) != EOF )
        {
            rc = _PDCLIB_GETC( stream );
        }
    }

    _PDCLIB_UNLOCK( stream->mtx );

    return rc;
}